

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O2

void Gia_ManSimSimulatePattern(Gia_Man_t *p,char *pFileIn,char *pFileOut)

{
  int iVar1;
  Vec_Int_t *vPat;
  Vec_Int_t *vPat_00;
  uint uVar2;
  
  vPat = Gia_ManSimReadFile(pFileIn);
  if (vPat != (Vec_Int_t *)0x0) {
    uVar2 = p->vCis->nSize - p->nRegs;
    if (vPat->nSize % (int)uVar2 == 0) {
      vPat_00 = Gia_ManSimSimulateOne(p,vPat);
      iVar1 = Gia_ManSimWriteFile(pFileOut,vPat_00,p->vCos->nSize - p->nRegs);
      if (iVar1 != 0) {
        printf("Output patterns are written into file \"%s\".\n",pFileOut);
      }
      Vec_IntFree(vPat);
    }
    else {
      printf("The number of 0s and 1s in the input file (%d) does not evenly divide by the number of primary inputs (%d).\n"
             ,(ulong)(uint)vPat->nSize,(ulong)uVar2);
      vPat_00 = vPat;
    }
    Vec_IntFree(vPat_00);
    return;
  }
  return;
}

Assistant:

void Gia_ManSimSimulatePattern( Gia_Man_t * p, char * pFileIn, char * pFileOut )
{
    Vec_Int_t * vPat, * vPatOut;
    vPat = Gia_ManSimReadFile( pFileIn );
    if ( vPat == NULL )
        return;
    if ( Vec_IntSize(vPat) % Gia_ManPiNum(p) )
    {
        printf( "The number of 0s and 1s in the input file (%d) does not evenly divide by the number of primary inputs (%d).\n", 
            Vec_IntSize(vPat), Gia_ManPiNum(p) );
        Vec_IntFree( vPat );
        return;
    }
    vPatOut = Gia_ManSimSimulateOne( p, vPat );
    if ( Gia_ManSimWriteFile( pFileOut, vPatOut, Gia_ManPoNum(p) ) )
        printf( "Output patterns are written into file \"%s\".\n", pFileOut );
    Vec_IntFree( vPat );
    Vec_IntFree( vPatOut );
}